

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int http_compress_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *err_message;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  FILE *httpfile;
  int contentlength;
  char contenttype [100];
  char contentencoding [100];
  char errorstr [1200];
  FILE *local_5d8;
  int local_5cc;
  char local_5c8;
  char cStack_5c7;
  char cStack_5c6;
  char cStack_5c5;
  char cStack_5c4;
  char cStack_5c3;
  char cStack_5c2;
  char cStack_5c1;
  char cStack_5c0;
  char cStack_5bf;
  char cStack_5be;
  char cStack_5bd;
  char cStack_5bc;
  char cStack_5bb;
  char cStack_5ba;
  char cStack_5b9;
  char cStack_5b8;
  char cStack_5b7;
  char cStack_5b6;
  char cStack_5b5;
  char cStack_5b4;
  char cStack_5b3;
  char cStack_5b2;
  char cStack_5b1;
  char cStack_5b0;
  char cStack_5af;
  char cStack_5ae;
  char cStack_5ad;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined3 uStack_550;
  char local_4e8 [1208];
  
  closehttpfile = 0;
  closediskfile = 0;
  closefdiskfile = 0;
  closememfile = 0;
  sVar3 = strlen(netoutfile);
  uVar4 = (uint)sVar3;
  if (uVar4 == 0) {
    url = "Output file not set, shouldn\'t have happened (http_compress_open)";
  }
  else if (rwmode == 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)env);
    if (iVar1 == 0) {
      signal(0xe,signal_handler);
      alarm(net_timeout);
      iVar1 = http_open_network(url,(FILE **)&local_5d8,(char *)&local_558,&local_5c8,&local_5cc);
      __stream = local_5d8;
      if (iVar1 == 0) {
        closehttpfile = closehttpfile + 1;
        uVar2 = fgetc(local_5d8);
        ungetc((int)(char)uVar2,__stream);
        if ((CONCAT31((undefined3)uStack_554,local_558._3_1_) != 0x70697a || local_558 != 0x7a672d78
            ) && (CONCAT35(uStack_550,CONCAT41(uStack_554,local_558._3_1_)) != 0x73736572706d6f ||
                  CONCAT44(uStack_554,local_558) != 0x6572706d6f632d78)) {
          auVar5[0] = -(cStack_5c5 == 'l');
          auVar5[1] = -(cStack_5c4 == 'i');
          auVar5[2] = -(cStack_5c3 == 'c');
          auVar5[3] = -(cStack_5c2 == 'a');
          auVar5[4] = -(cStack_5c1 == 't');
          auVar5[5] = -(cStack_5c0 == 'i');
          auVar5[6] = -(cStack_5bf == 'o');
          auVar5[7] = -(cStack_5be == 'n');
          auVar5[8] = -(cStack_5bd == '/');
          auVar5[9] = -(cStack_5bc == 'x');
          auVar5[10] = -(cStack_5bb == '-');
          auVar5[0xb] = -(cStack_5ba == 'g');
          auVar5[0xc] = -(cStack_5b9 == 'z');
          auVar5[0xd] = -(cStack_5b8 == 'i');
          auVar5[0xe] = -(cStack_5b7 == 'p');
          auVar5[0xf] = -(cStack_5b6 == '\0');
          auVar7[0] = -(local_5c8 == 'a');
          auVar7[1] = -(cStack_5c7 == 'p');
          auVar7[2] = -(cStack_5c6 == 'p');
          auVar7[3] = -(cStack_5c5 == 'l');
          auVar7[4] = -(cStack_5c4 == 'i');
          auVar7[5] = -(cStack_5c3 == 'c');
          auVar7[6] = -(cStack_5c2 == 'a');
          auVar7[7] = -(cStack_5c1 == 't');
          auVar7[8] = -(cStack_5c0 == 'i');
          auVar7[9] = -(cStack_5bf == 'o');
          auVar7[10] = -(cStack_5be == 'n');
          auVar7[0xb] = -(cStack_5bd == '/');
          auVar7[0xc] = -(cStack_5bc == 'x');
          auVar7[0xd] = -(cStack_5bb == '-');
          auVar7[0xe] = -(cStack_5ba == 'g');
          auVar7[0xf] = -(cStack_5b9 == 'z');
          auVar7 = auVar7 & auVar5;
          if (((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) &&
             ((cStack_5b8 != '\0' ||
              CONCAT17(cStack_5c1,
                       CONCAT16(cStack_5c2,
                                CONCAT15(cStack_5c3,
                                         CONCAT14(cStack_5c4,
                                                  CONCAT13(cStack_5c5,
                                                           CONCAT12(cStack_5c6,
                                                                    CONCAT11(cStack_5c7,local_5c8)))
                                                 )))) != 0x746163696c707061) ||
              CONCAT17(cStack_5b9,
                       CONCAT16(cStack_5ba,
                                CONCAT15(cStack_5bb,
                                         CONCAT14(cStack_5bc,
                                                  CONCAT13(cStack_5bd,
                                                           CONCAT12(cStack_5be,
                                                                    CONCAT11(cStack_5bf,cStack_5c0))
                                                          ))))) != 0x70697a672f6e6f69)) {
            auVar14[0] = -(local_5c8 == 'a');
            auVar14[1] = -(cStack_5c7 == 'p');
            auVar14[2] = -(cStack_5c6 == 'p');
            auVar14[3] = -(cStack_5c5 == 'l');
            auVar14[4] = -(cStack_5c4 == 'i');
            auVar14[5] = -(cStack_5c3 == 'c');
            auVar14[6] = -(cStack_5c2 == 'a');
            auVar14[7] = -(cStack_5c1 == 't');
            auVar14[8] = -(cStack_5c0 == 'i');
            auVar14[9] = -(cStack_5bf == 'o');
            auVar14[10] = -(cStack_5be == 'n');
            auVar14[0xb] = -(cStack_5bd == '/');
            auVar14[0xc] = -(cStack_5bc == 'g');
            auVar14[0xd] = -(cStack_5bb == 'z');
            auVar14[0xe] = -(cStack_5ba == 'i');
            auVar14[0xf] = -(cStack_5b9 == 'p');
            auVar11[0] = -(cStack_5bc == 'g');
            auVar11[1] = -(cStack_5bb == 'z');
            auVar11[2] = -(cStack_5ba == 'i');
            auVar11[3] = -(cStack_5b9 == 'p');
            auVar11[4] = -(cStack_5b8 == '-');
            auVar11[5] = -(cStack_5b7 == 'c');
            auVar11[6] = -(cStack_5b6 == 'o');
            auVar11[7] = -(cStack_5b5 == 'm');
            auVar11[8] = -(cStack_5b4 == 'p');
            auVar11[9] = -(cStack_5b3 == 'r');
            auVar11[10] = -(cStack_5b2 == 'e');
            auVar11[0xb] = -(cStack_5b1 == 's');
            auVar11[0xc] = -(cStack_5b0 == 's');
            auVar11[0xd] = -(cStack_5af == 'e');
            auVar11[0xe] = -(cStack_5ae == 'd');
            auVar11[0xf] = -(cStack_5ad == '\0');
            auVar11 = auVar11 & auVar14;
            if ((((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) &&
                (auVar8[0] = -(local_5c8 == 'a'), auVar8[1] = -(cStack_5c7 == 'p'),
                auVar8[2] = -(cStack_5c6 == 'p'), auVar8[3] = -(cStack_5c5 == 'l'),
                auVar8[4] = -(cStack_5c4 == 'i'), auVar8[5] = -(cStack_5c3 == 'c'),
                auVar8[6] = -(cStack_5c2 == 'a'), auVar8[7] = -(cStack_5c1 == 't'),
                auVar8[8] = -(cStack_5c0 == 'i'), auVar8[9] = -(cStack_5bf == 'o'),
                auVar8[10] = -(cStack_5be == 'n'), auVar8[0xb] = -(cStack_5bd == '/'),
                auVar8[0xc] = -(cStack_5bc == 'g'), auVar8[0xd] = -(cStack_5bb == 'z'),
                auVar8[0xe] = -(cStack_5ba == 'i'), auVar8[0xf] = -(cStack_5b9 == 'p'),
                auVar12[0] = -(cStack_5b8 == 'p'), auVar12[1] = -(cStack_5b7 == 'e'),
                auVar12[2] = -(cStack_5b6 == 'd'), auVar12[3] = -(cStack_5b5 == '\0'),
                auVar12[4] = 0xff, auVar12[5] = 0xff, auVar12[6] = 0xff, auVar12[7] = 0xff,
                auVar12[8] = 0xff, auVar12[9] = 0xff, auVar12[10] = 0xff, auVar12[0xb] = 0xff,
                auVar12[0xc] = 0xff, auVar12[0xd] = 0xff, auVar12[0xe] = 0xff, auVar12[0xf] = 0xff,
                auVar12 = auVar12 & auVar8,
                (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff)) &&
               (auVar9[0] = -(cStack_5c1 == 't'), auVar9[1] = -(cStack_5c0 == 'i'),
               auVar9[2] = -(cStack_5bf == 'o'), auVar9[3] = -(cStack_5be == 'n'),
               auVar9[4] = -(cStack_5bd == '/'), auVar9[5] = -(cStack_5bc == 'x'),
               auVar9[6] = -(cStack_5bb == '-'), auVar9[7] = -(cStack_5ba == 'c'),
               auVar9[8] = -(cStack_5b9 == 'o'), auVar9[9] = -(cStack_5b8 == 'm'),
               auVar9[10] = -(cStack_5b7 == 'p'), auVar9[0xb] = -(cStack_5b6 == 'r'),
               auVar9[0xc] = -(cStack_5b5 == 'e'), auVar9[0xd] = -(cStack_5b4 == 's'),
               auVar9[0xe] = -(cStack_5b3 == 's'), auVar9[0xf] = -(cStack_5b2 == '\0'),
               auVar13[0] = -(local_5c8 == 'a'), auVar13[1] = -(cStack_5c7 == 'p'),
               auVar13[2] = -(cStack_5c6 == 'p'), auVar13[3] = -(cStack_5c5 == 'l'),
               auVar13[4] = -(cStack_5c4 == 'i'), auVar13[5] = -(cStack_5c3 == 'c'),
               auVar13[6] = -(cStack_5c2 == 'a'), auVar13[7] = -(cStack_5c1 == 't'),
               auVar13[8] = -(cStack_5c0 == 'i'), auVar13[9] = -(cStack_5bf == 'o'),
               auVar13[10] = -(cStack_5be == 'n'), auVar13[0xb] = -(cStack_5bd == '/'),
               auVar13[0xc] = -(cStack_5bc == 'x'), auVar13[0xd] = -(cStack_5bb == '-'),
               auVar13[0xe] = -(cStack_5ba == 'c'), auVar13[0xf] = -(cStack_5b9 == 'o'),
               auVar13 = auVar13 & auVar9,
               (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) {
              auVar6[0] = -(local_5c8 == 'a');
              auVar6[1] = -(cStack_5c7 == 'p');
              auVar6[2] = -(cStack_5c6 == 'p');
              auVar6[3] = -(cStack_5c5 == 'l');
              auVar6[4] = -(cStack_5c4 == 'i');
              auVar6[5] = -(cStack_5c3 == 'c');
              auVar6[6] = -(cStack_5c2 == 'a');
              auVar6[7] = -(cStack_5c1 == 't');
              auVar6[8] = -(cStack_5c0 == 'i');
              auVar6[9] = -(cStack_5bf == 'o');
              auVar6[10] = -(cStack_5be == 'n');
              auVar6[0xb] = -(cStack_5bd == '/');
              auVar6[0xc] = -(cStack_5bc == 'x');
              auVar6[0xd] = -(cStack_5bb == '-');
              auVar6[0xe] = -(cStack_5ba == 'c');
              auVar6[0xf] = -(cStack_5b9 == 'o');
              auVar10[0] = -(cStack_5bf == 'o');
              auVar10[1] = -(cStack_5be == 'n');
              auVar10[2] = -(cStack_5bd == '/');
              auVar10[3] = -(cStack_5bc == 'x');
              auVar10[4] = -(cStack_5bb == '-');
              auVar10[5] = -(cStack_5ba == 'c');
              auVar10[6] = -(cStack_5b9 == 'o');
              auVar10[7] = -(cStack_5b8 == 'm');
              auVar10[8] = -(cStack_5b7 == 'p');
              auVar10[9] = -(cStack_5b6 == 'r');
              auVar10[10] = -(cStack_5b5 == 'e');
              auVar10[0xb] = -(cStack_5b4 == 's');
              auVar10[0xc] = -(cStack_5b3 == 's');
              auVar10[0xd] = -(cStack_5b2 == 'e');
              auVar10[0xe] = -(cStack_5b1 == 'd');
              auVar10[0xf] = -(cStack_5b0 == '\0');
              auVar10 = auVar10 & auVar6;
              if (((uVar2 & 0xff) != 0x1f) &&
                 ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff)) {
                url = "Can only have compressed files here (http_compress_open)";
                goto LAB_001348ca;
              }
            }
          }
        }
        if (netoutfile[0] == '!') {
          if (0 < (int)uVar4) {
            memmove(netoutfile,netoutfile + 1,(ulong)(uVar4 & 0x7fffffff));
          }
          file_remove(netoutfile);
        }
        iVar1 = file_create(netoutfile,handle);
        if (iVar1 == 0) {
          closediskfile = closediskfile + 1;
          alarm(net_timeout);
          sVar3 = fread(local_4e8,1,0x4b0,__stream);
          if (sVar3 != 0) {
            do {
              alarm(0);
              iVar1 = file_write(*handle,local_4e8,sVar3);
              if (iVar1 != 0) {
                err_message = "Error writing disk file (http_compres_open)";
                goto LAB_001348be;
              }
              alarm(net_timeout);
              sVar3 = fread(local_4e8,1,0x4b0,__stream);
            } while (sVar3 != 0);
          }
          file_close(*handle);
          fclose(__stream);
          closehttpfile = closehttpfile + -1;
          closediskfile = closediskfile + -1;
          diskfile = (FILE *)fopen(netoutfile,"r");
          if ((FILE *)diskfile == (FILE *)0x0) {
            err_message = "Unable to reopen disk file (http_compress_open)";
          }
          else {
            closefdiskfile = closefdiskfile + 1;
            iVar1 = mem_create(url,handle);
            if (iVar1 != 0) {
              url = "Unable to create memory file (http_compress_open)";
              goto LAB_001348ca;
            }
            closememfile = closememfile + 1;
            iVar1 = mem_uncompress2mem(url,diskfile,*handle);
            fclose((FILE *)diskfile);
            closefdiskfile = closefdiskfile + -1;
            if (iVar1 == 0) {
              signal(0xe,(__sighandler_t)0x0);
              alarm(0);
              iVar1 = mem_seek(*handle,0);
              return iVar1;
            }
            err_message = "Error uncompressing disk file to memory (http_compress_open)";
          }
        }
        else {
          err_message = "Unable to create output disk file (http_compress_open):";
        }
LAB_001348be:
        ffpmsg(err_message);
        url = netoutfile;
      }
      else {
        alarm(0);
        ffpmsg("Unable to open http file (http_compress_open)");
      }
    }
    else {
      ffpmsg("Timeout (http_open)");
      snprintf(local_4e8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
      ffpmsg(local_4e8);
      url = "   Timeout may be adjusted with fits_set_timeout";
    }
  }
  else {
    ffpmsg("Can\'t open compressed http:// type file with READWRITE access");
    url = "  Specify an UNCOMPRESSED outfile (http_compress_open)";
  }
LAB_001348ca:
  ffpmsg(url);
  alarm(0);
  if (closehttpfile != 0) {
    fclose(local_5d8);
  }
  if (closefdiskfile != 0) {
    fclose((FILE *)diskfile);
  }
  if (closememfile != 0) {
    mem_close_free(*handle);
  }
  if (closediskfile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int http_compress_open(char *url, int rwmode, int *handle)
{
  FILE *httpfile;
  char contentencoding[SHORTLEN], contenttype[SHORTLEN];
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int contentlength;
  int ii, flen, status;
  char firstchar;

  closehttpfile = 0;
  closediskfile = 0;
  closefdiskfile = 0;
  closememfile = 0;

  flen = strlen(netoutfile);
  if (!flen)  {
     /* cfileio made a mistake, should set the netoufile first otherwise 
        we don't know where to write the output file */
     ffpmsg
	("Output file not set, shouldn't have happened (http_compress_open)");
      goto error;
  }

  if (rwmode != 0) {
    ffpmsg("Can't open compressed http:// type file with READWRITE access");
    ffpmsg("  Specify an UNCOMPRESSED outfile (http_compress_open)");
    goto error;
  }
  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the http connectin */
  alarm(net_timeout);
  if ((status = http_open_network(url,&httpfile, contentencoding, 
				  contenttype, &contentlength))) {
    alarm(0);
    ffpmsg("Unable to open http file (http_compress_open)");
    ffpmsg(url);
    goto error;
  }

  closehttpfile++;

  /* Better be compressed */

  firstchar = fgetc(httpfile);
  ungetc(firstchar,httpfile);
  if (!strcmp(contentencoding,"x-gzip") || 
      !strcmp(contentencoding,"x-compress") ||
      !strcmp(contenttype, "application/x-gzip") ||
      !strcmp(contenttype, "application/gzip") ||
      !strcmp(contenttype, "application/gzip-compressed") ||
      !strcmp(contenttype, "application/gzipped") ||
      !strcmp(contenttype, "application/x-compress") ||
      !strcmp(contenttype, "application/x-compressed") ||
      ('\037' == firstchar)) {

    if (*netoutfile == '!')
    {
       /* user wants to clobber file, if it already exists */
       for (ii = 0; ii < flen; ii++)
           netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

       status = file_remove(netoutfile);
    }

    /* Create the new file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output disk file (http_compress_open):");
      ffpmsg(netoutfile);
      goto error;
    }
    
    closediskfile++;

    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,httpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing disk file (http_compres_open)");
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }
    file_close(*handle);
    fclose(httpfile);
    closehttpfile--;
    closediskfile--;

    /* File is on disk, let's uncompress it into memory */

    if (NULL == (diskfile = fopen(netoutfile,"r"))) {
      ffpmsg("Unable to reopen disk file (http_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closefdiskfile++;

    /* Create the memory handle to hold it */
    if ((status =  mem_create(url,handle))) {
      ffpmsg("Unable to create memory file (http_compress_open)");
      goto error;
    }
    closememfile++;

    /* Uncompress it */
    status = 0;
    status = mem_uncompress2mem(url,diskfile,*handle);
    fclose(diskfile);
    closefdiskfile--;
    if (status) {
      ffpmsg("Error uncompressing disk file to memory (http_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
      
  } else {
    /* Opps, this should not have happened */
    ffpmsg("Can only have compressed files here (http_compress_open)");
    goto error;
  }    
    
  signal(SIGALRM, SIG_DFL);
  alarm(0);
  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closehttpfile) {
    fclose(httpfile);
  }
  if (closefdiskfile) {
    fclose(diskfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  if (closediskfile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}